

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scala_kbm.cpp
# Opt level: O2

kbm * scala::read_kbm(kbm *__return_storage_ptr__,ifstream *input_file)

{
  bool bVar1;
  int iVar2;
  runtime_error *this;
  ulong uVar3;
  regex EX;
  regex COMMENT_REGEX;
  string buffer;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mapping).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->mapping).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->last_note = 0;
  __return_storage_ptr__->middle_note = 0;
  __return_storage_ptr__->reference_note = 0;
  __return_storage_ptr__->octave_degree = 0;
  __return_storage_ptr__->reference_frequency = 0.0;
  __return_storage_ptr__->map_size = 0;
  __return_storage_ptr__->first_note = 0;
  (__return_storage_ptr__->mapping).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&COMMENT_REGEX,"[ \t]*!.*",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&EX,"^[ \t]*[xX]{1}.*",0x10);
  while (((byte)input_file[*(long *)(*(long *)input_file + -0x18) + 0x20] & 5) == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)input_file,(string *)&buffer);
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (&buffer,&COMMENT_REGEX,0);
    if (!bVar1) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&local_50,"[ \t]*",0x10);
      bVar1 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        (&buffer,&local_50,0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
      if (!bVar1) {
        iVar2 = std::__cxx11::stoi(&buffer,(size_t *)0x0,10);
        __return_storage_ptr__->map_size = iVar2;
      }
    }
  }
  iVar2 = __return_storage_ptr__->map_size;
  uVar3 = (long)(__return_storage_ptr__->mapping).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(__return_storage_ptr__->mapping).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start >> 2;
  if (uVar3 != (long)iVar2) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    if ((ulong)(long)iVar2 < uVar3) {
      std::runtime_error::runtime_error(this,"ERROR: Too few entires in mapping file");
    }
    else {
      std::runtime_error::runtime_error(this,"ERROR: Too many entires in mapping file");
    }
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&EX);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&COMMENT_REGEX);
  std::__cxx11::string::~string((string *)&buffer);
  return __return_storage_ptr__;
}

Assistant:

kbm read_kbm(std::ifstream& input_file){
        std::string buffer;
        unsigned int current_entry = 0;
        kbm keyboard_mapping;

#ifdef SCALA_STRICT
        std::regex COMMENT_REGEX = std::regex("^!.*");
        std::regex EX = std::regex("^[ \t]*[x]{1}.*");
#else
        std::regex COMMENT_REGEX = std::regex("[ \t]*!.*");
        std::regex EX = std::regex("^[ \t]*[xX]{1}.*");
#endif
    
        while(input_file){
            getline(input_file, buffer);
            if (std::regex_match (buffer, COMMENT_REGEX)) {
                // Ignore comments
            } else if (std::regex_match (buffer, std::regex("[ \t]*") )) {
                // Blank line. If we're in strict mode this means end of file.
                // Stop parsing.
#ifdef SCALA_STRICT
                break;
#endif
            } else {
                switch(current_entry){
                    case MAP_SIZE: 
                        keyboard_mapping.map_size = std::stoi(buffer);
                        current_entry += 1;
                        break;
                    case FIRST_NOTE: 
                        keyboard_mapping.first_note = std::stoi(buffer);
                        current_entry += 1;
                        break;
                    case LAST_NOTE: 
                        keyboard_mapping.last_note = std::stoi(buffer);
                        current_entry += 1;
                        break;
                    case MIDDLE_NOTE: 
                        keyboard_mapping.middle_note = std::stoi(buffer);
                        current_entry += 1;
                        break;
                    case REFERENCE_NOTE: 
                        keyboard_mapping.reference_note = std::stoi(buffer);
                        current_entry += 1;
                        break;
                    case REFERENCE_FREQUENCY: 
                        keyboard_mapping.reference_frequency = std::stod(buffer);
                        current_entry += 1;
                        break;
                    case OCTAVE_DEGREE: 
                        keyboard_mapping.octave_degree = std::stoi(buffer);
                        current_entry += 1;
                        break;
                    case ACTUAL_MAP:
                        // This one is a little more complicated.  If we have an x
                        if (std::regex_match (buffer, EX)) {
                            // A non-entry
                            keyboard_mapping.add_mapping(KBM_NON_ENTRY);
                        } else {
                            // A mapping entry
                            keyboard_mapping.add_mapping(std::stoi(buffer));
                        }
                }
            }
        }
        if (static_cast <size_t> (keyboard_mapping.map_size) != keyboard_mapping.mapping.size()){
            // This is an error, strict mode or not 
            if (static_cast <size_t> (keyboard_mapping.map_size) < keyboard_mapping.mapping.size()){
                throw std::runtime_error("ERROR: Too few entires in mapping file");
            } else {
                throw std::runtime_error("ERROR: Too many entires in mapping file");
            }
        }
        return keyboard_mapping;
    }